

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpconn.c
# Opt level: O3

int tcp_get_peername(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  int *piVar2;
  undefined1 local_138 [8];
  nng_sockaddr sa;
  sockaddr_storage ss;
  socklen_t len;
  
  ss.__ss_align._4_4_ = 0x80;
  iVar1 = nni_posix_pfd_fd((nni_posix_pfd *)((long)arg + 0x38));
  iVar1 = getpeername(iVar1,(sockaddr *)(sa.s_ipc.sa_path + 0x7e),
                      (socklen_t *)((long)&ss.__ss_align + 4));
  if (iVar1 == 0) {
    iVar1 = nni_posix_sockaddr2nn
                      ((nni_sockaddr *)local_138,sa.s_ipc.sa_path + 0x7e,(ulong)ss.__ss_align._4_4_)
    ;
    if (iVar1 == 0) {
      iVar1 = nni_copyout_sockaddr((nng_sockaddr *)local_138,buf,szp,t);
    }
  }
  else {
    piVar2 = __errno_location();
    iVar1 = nni_plat_errno(*piVar2);
  }
  return iVar1;
}

Assistant:

static int
tcp_get_peername(void *arg, void *buf, size_t *szp, nni_type t)
{
	nni_tcp_conn           *c = arg;
	struct sockaddr_storage ss;
	socklen_t               len = sizeof(ss);
	int                     fd  = nni_posix_pfd_fd(&c->pfd);
	int                     rv;
	nng_sockaddr            sa;

	if (getpeername(fd, (void *) &ss, &len) != 0) {
		return (nni_plat_errno(errno));
	}
	if ((rv = nni_posix_sockaddr2nn(&sa, &ss, len)) == 0) {
		rv = nni_copyout_sockaddr(&sa, buf, szp, t);
	}
	return (rv);
}